

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O0

void __thiscall
anon_unknown.dwarf_83f614::CodemodelConfig::ProcessDirectories(CodemodelConfig *this)

{
  cmStateSnapshot s;
  mapped_type_conflict1 mVar1;
  bool bVar2;
  ArrayIndex AVar3;
  cmake *this_00;
  cmGlobalGenerator *this_01;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *this_02;
  size_type sVar4;
  reference ppcVar5;
  mapped_type_conflict1 *pmVar6;
  reference pvVar7;
  reference this_03;
  cmMakefile *this_04;
  vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_> *this_05;
  reference ppcVar8;
  reference pvVar9;
  vector<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
  *this_06;
  long local_1d0;
  undefined1 auStack_160 [4];
  ArrayIndex childIndex;
  cmStateSnapshot childDir;
  cmStateSnapshot *child;
  __normal_iterator<cmStateSnapshot_*,_std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>_>
  local_138;
  iterator __end3;
  iterator __begin3;
  vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *__range3;
  cmInstallGenerator *gen;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_> *__range2;
  Directory *d_1;
  reverse_iterator di;
  Value local_c0;
  cmState *local_98;
  cmLinkedTree<cmStateDetail::SnapshotDataType> *pcStack_90;
  PositionType local_88;
  cmStateSnapshot local_80;
  cmStateSnapshot local_68;
  reference local_50;
  Directory *d;
  cmLocalGenerator *pcStack_40;
  ArrayIndex directoryIndex;
  cmLocalGenerator *lg;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *__range1;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *localGens;
  cmGlobalGenerator *gg;
  CodemodelConfig *this_local;
  
  this_00 = cmFileAPI::GetCMakeInstance(this->FileAPI);
  this_01 = cmake::GetGlobalGenerator(this_00);
  this_02 = cmGlobalGenerator::GetLocalGenerators(this_01);
  sVar4 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::size(this_02);
  std::
  vector<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
  ::reserve(&this->Directories,sVar4);
  __end1 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::begin(this_02);
  lg = (cmLocalGenerator *)
       std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::end(this_02);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                                     *)&lg), bVar2) {
    ppcVar5 = __gnu_cxx::
              __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
              ::operator*(&__end1);
    pcStack_40 = *ppcVar5;
    this_06 = &this->Directories;
    sVar4 = std::
            vector<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
            ::size(this_06);
    d._4_4_ = (uint)sVar4;
    std::
    vector<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
    ::emplace_back<>(this_06);
    local_50 = std::
               vector<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
               ::operator[](this_06,(ulong)d._4_4_);
    cmLocalGenerator::GetStateSnapshot(&local_80,pcStack_40);
    cmStateSnapshot::GetBuildsystemDirectory(&local_68,&local_80);
    mVar1 = d._4_4_;
    (local_50->Snapshot).Position.Position = local_68.Position.Position;
    (local_50->Snapshot).State = local_68.State;
    (local_50->Snapshot).Position.Tree = local_68.Position.Tree;
    local_50->LocalGenerator = pcStack_40;
    pmVar6 = std::
             map<cmStateSnapshot,_unsigned_int,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_unsigned_int>_>_>
             ::operator[](&this->DirectoryMap,&local_50->Snapshot);
    *pmVar6 = mVar1;
    local_88 = (local_50->Snapshot).Position.Position;
    local_98 = (local_50->Snapshot).State;
    pcStack_90 = (local_50->Snapshot).Position.Tree;
    AVar3 = AddProject(this,local_50->Snapshot);
    local_50->ProjectIndex = AVar3;
    pvVar7 = std::
             vector<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
             ::operator[](&this->Projects,(ulong)local_50->ProjectIndex);
    Json::Value::Value(&local_c0,d._4_4_);
    Json::Value::append(&pvVar7->DirectoryIndexes,&local_c0);
    Json::Value::~Value(&local_c0);
    __gnu_cxx::
    __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
    ::operator++(&__end1);
  }
  std::
  vector<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
  ::rbegin((vector<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
            *)&stack0xffffffffffffff28);
  do {
    std::
    vector<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
    ::rend((vector<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
            *)&d_1);
    bVar2 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<(anonymous_namespace)::CodemodelConfig::Directory_*,_std::vector<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>_>_>
                             *)&stack0xffffffffffffff28,
                            (reverse_iterator<__gnu_cxx::__normal_iterator<(anonymous_namespace)::CodemodelConfig::Directory_*,_std::vector<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>_>_>
                             *)&d_1);
    if (!bVar2) {
      return;
    }
    this_03 = std::
              reverse_iterator<__gnu_cxx::__normal_iterator<(anonymous_namespace)::CodemodelConfig::Directory_*,_std::vector<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>_>_>
              ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<(anonymous_namespace)::CodemodelConfig::Directory_*,_std::vector<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>_>_>
                           *)&stack0xffffffffffffff28);
    this_04 = cmLocalGenerator::GetMakefile(this_03->LocalGenerator);
    this_05 = cmMakefile::GetInstallGenerators(this_04);
    __end2 = std::vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>::begin
                       (this_05);
    gen = (cmInstallGenerator *)
          std::vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>::end(this_05);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<cmInstallGenerator_*const_*,_std::vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>_>
                                       *)&gen), bVar2) {
      ppcVar8 = __gnu_cxx::
                __normal_iterator<cmInstallGenerator_*const_*,_std::vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>_>
                ::operator*(&__end2);
      if (*ppcVar8 == (cmInstallGenerator *)0x0) {
        local_1d0 = 0;
      }
      else {
        local_1d0 = __dynamic_cast(*ppcVar8,&cmInstallGenerator::typeinfo,
                                   &cmInstallSubdirectoryGenerator::typeinfo,0);
      }
      if (local_1d0 == 0) {
        this_03->HasInstallRule = true;
        break;
      }
      __gnu_cxx::
      __normal_iterator<cmInstallGenerator_*const_*,_std::vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>_>
      ::operator++(&__end2);
    }
    if ((this_03->HasInstallRule & 1U) == 0) {
      cmStateSnapshot::GetChildren
                ((vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *)&__begin3,
                 &this_03->Snapshot);
      __end3 = std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>::begin
                         ((vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *)&__begin3);
      local_138._M_current =
           (cmStateSnapshot *)
           std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>::end
                     ((vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *)&__begin3);
      while (bVar2 = __gnu_cxx::operator!=(&__end3,&local_138), bVar2) {
        childDir.Position.Position =
             (PositionType)
             __gnu_cxx::
             __normal_iterator<cmStateSnapshot_*,_std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>_>
             ::operator*(&__end3);
        cmStateSnapshot::GetBuildsystemDirectory
                  ((cmStateSnapshot *)auStack_160,(cmStateSnapshot *)childDir.Position.Position);
        s.Position.Tree = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)childDir.State;
        s.State = _auStack_160;
        s.Position.Position = (PositionType)childDir.Position.Tree;
        AVar3 = GetDirectoryIndex(this,s);
        pvVar9 = std::
                 vector<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                 ::operator[](&this->Directories,(ulong)AVar3);
        if ((pvVar9->HasInstallRule & 1U) != 0) {
          this_03->HasInstallRule = true;
          break;
        }
        __gnu_cxx::
        __normal_iterator<cmStateSnapshot_*,_std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>_>
        ::operator++(&__end3);
      }
      std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>::~vector
                ((vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *)&__begin3);
    }
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<(anonymous_namespace)::CodemodelConfig::Directory_*,_std::vector<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>_>_>
    ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<(anonymous_namespace)::CodemodelConfig::Directory_*,_std::vector<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>_>_>
                  *)&stack0xffffffffffffff28);
  } while( true );
}

Assistant:

void CodemodelConfig::ProcessDirectories()
{
  cmGlobalGenerator* gg =
    this->FileAPI.GetCMakeInstance()->GetGlobalGenerator();
  std::vector<cmLocalGenerator*> const& localGens = gg->GetLocalGenerators();

  // Add directories in forward order to process parents before children.
  this->Directories.reserve(localGens.size());
  for (cmLocalGenerator* lg : localGens) {
    auto directoryIndex =
      static_cast<Json::ArrayIndex>(this->Directories.size());
    this->Directories.emplace_back();
    Directory& d = this->Directories[directoryIndex];
    d.Snapshot = lg->GetStateSnapshot().GetBuildsystemDirectory();
    d.LocalGenerator = lg;
    this->DirectoryMap[d.Snapshot] = directoryIndex;

    d.ProjectIndex = this->AddProject(d.Snapshot);
    this->Projects[d.ProjectIndex].DirectoryIndexes.append(directoryIndex);
  }

  // Update directories in reverse order to process children before parents.
  for (auto di = this->Directories.rbegin(); di != this->Directories.rend();
       ++di) {
    Directory& d = *di;

    // Accumulate the presence of install rules on the way up.
    for (auto gen : d.LocalGenerator->GetMakefile()->GetInstallGenerators()) {
      if (!dynamic_cast<cmInstallSubdirectoryGenerator*>(gen)) {
        d.HasInstallRule = true;
        break;
      }
    }
    if (!d.HasInstallRule) {
      for (cmStateSnapshot const& child : d.Snapshot.GetChildren()) {
        cmStateSnapshot childDir = child.GetBuildsystemDirectory();
        Json::ArrayIndex const childIndex = this->GetDirectoryIndex(childDir);
        if (this->Directories[childIndex].HasInstallRule) {
          d.HasInstallRule = true;
          break;
        }
      }
    }
  }
}